

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btrd.h
# Opt level: O0

IntType IsoSpec::invert(IntType t,RealType p,mt19937 *urng)

{
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  RealType r1;
  IntType x;
  RealType u;
  RealType r;
  RealType a;
  RealType s;
  RealType q;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffffa8;
  uniform_real_distribution<double> *in_stack_ffffffffffffffb0;
  long local_48;
  double local_40;
  double local_38;
  
  dVar1 = in_XMM0_Qa / (1.0 - in_XMM0_Qa);
  dVar2 = pow(1.0 - in_XMM0_Qa,(double)in_RDI);
  local_40 = std::uniform_real_distribution<double>::operator()
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_48 = 0;
  do {
    local_38 = dVar2;
    if (local_40 <= local_38) {
      return local_48;
    }
    local_40 = local_40 - local_38;
    local_48 = local_48 + 1;
    dVar3 = (((double)(in_RDI + 1) * dVar1) / (double)local_48 - dVar1) * local_38;
    dVar2 = dVar3;
    dVar4 = std::numeric_limits<double>::epsilon();
  } while ((dVar4 <= dVar3) || (local_38 <= dVar2));
  return local_48;
}

Assistant:

IntType invert(IntType t, RealType p, std::mt19937& urng = random_gen)
{
    RealType q = 1 - p;
    RealType s = p / q;
    RealType a = (t + 1) * s;
    RealType r = pow((1 - p), static_cast<RealType>(t));
    RealType u = stdunif(urng);
    IntType x = 0;
    while(u > r) {
        u = u - r;
        ++x;
        RealType r1 = ((a/x) - s) * r;
        // If r gets too small then the round-off error
        // becomes a problem.  At this point, p(i) is
        // decreasing exponentially, so if we just call
        // it 0, it's close enough.  Note that the
        // minimum value of q_n is about 1e-7, so we
        // may need to be a little careful to make sure that
        // we don't terminate the first time through the loop
        // for float.  (Hence the test that r is decreasing)
        if(r1 < std::numeric_limits<RealType>::epsilon() && r1 < r) {
            break;
        }
        r = r1;
    }
    return x;
}